

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsTypes.h
# Opt level: O0

void __thiscall
Diligent::DeviceFeatures::DeviceFeatures(DeviceFeatures *this,DEVICE_FEATURE_STATE State)

{
  DEVICE_FEATURE_STATE State_local;
  DeviceFeatures *this_local;
  
  this->SeparablePrograms = DEVICE_FEATURE_STATE_DISABLED;
  this->ShaderResourceQueries = DEVICE_FEATURE_STATE_DISABLED;
  this->WireframeFill = DEVICE_FEATURE_STATE_DISABLED;
  this->MultithreadedResourceCreation = DEVICE_FEATURE_STATE_DISABLED;
  this->ComputeShaders = DEVICE_FEATURE_STATE_DISABLED;
  this->GeometryShaders = DEVICE_FEATURE_STATE_DISABLED;
  this->Tessellation = DEVICE_FEATURE_STATE_DISABLED;
  this->MeshShaders = DEVICE_FEATURE_STATE_DISABLED;
  this->RayTracing = DEVICE_FEATURE_STATE_DISABLED;
  this->BindlessResources = DEVICE_FEATURE_STATE_DISABLED;
  this->OcclusionQueries = DEVICE_FEATURE_STATE_DISABLED;
  this->BinaryOcclusionQueries = DEVICE_FEATURE_STATE_DISABLED;
  this->TimestampQueries = DEVICE_FEATURE_STATE_DISABLED;
  this->PipelineStatisticsQueries = DEVICE_FEATURE_STATE_DISABLED;
  this->DurationQueries = DEVICE_FEATURE_STATE_DISABLED;
  this->DepthBiasClamp = DEVICE_FEATURE_STATE_DISABLED;
  this->DepthClamp = DEVICE_FEATURE_STATE_DISABLED;
  this->IndependentBlend = DEVICE_FEATURE_STATE_DISABLED;
  this->DualSourceBlend = DEVICE_FEATURE_STATE_DISABLED;
  this->MultiViewport = DEVICE_FEATURE_STATE_DISABLED;
  this->TextureCompressionBC = DEVICE_FEATURE_STATE_DISABLED;
  this->TextureCompressionETC2 = DEVICE_FEATURE_STATE_DISABLED;
  this->VertexPipelineUAVWritesAndAtomics = DEVICE_FEATURE_STATE_DISABLED;
  this->PixelUAVWritesAndAtomics = DEVICE_FEATURE_STATE_DISABLED;
  this->TextureUAVExtendedFormats = DEVICE_FEATURE_STATE_DISABLED;
  this->ShaderFloat16 = DEVICE_FEATURE_STATE_DISABLED;
  this->ResourceBuffer16BitAccess = DEVICE_FEATURE_STATE_DISABLED;
  this->UniformBuffer16BitAccess = DEVICE_FEATURE_STATE_DISABLED;
  this->ShaderInputOutput16 = DEVICE_FEATURE_STATE_DISABLED;
  this->ShaderInt8 = DEVICE_FEATURE_STATE_DISABLED;
  this->ResourceBuffer8BitAccess = DEVICE_FEATURE_STATE_DISABLED;
  this->UniformBuffer8BitAccess = DEVICE_FEATURE_STATE_DISABLED;
  this->ShaderResourceStaticArrays = DEVICE_FEATURE_STATE_DISABLED;
  this->ShaderResourceRuntimeArrays = DEVICE_FEATURE_STATE_DISABLED;
  this->WaveOp = DEVICE_FEATURE_STATE_DISABLED;
  this->InstanceDataStepRate = DEVICE_FEATURE_STATE_DISABLED;
  this->NativeFence = DEVICE_FEATURE_STATE_DISABLED;
  this->TileShaders = DEVICE_FEATURE_STATE_DISABLED;
  this->TransferQueueTimestampQueries = DEVICE_FEATURE_STATE_DISABLED;
  this->VariableRateShading = DEVICE_FEATURE_STATE_DISABLED;
  this->SparseResources = DEVICE_FEATURE_STATE_DISABLED;
  this->SubpassFramebufferFetch = DEVICE_FEATURE_STATE_DISABLED;
  this->TextureComponentSwizzle = DEVICE_FEATURE_STATE_DISABLED;
  this->TextureSubresourceViews = DEVICE_FEATURE_STATE_DISABLED;
  this->NativeMultiDraw = DEVICE_FEATURE_STATE_DISABLED;
  this->AsyncShaderCompilation = DEVICE_FEATURE_STATE_DISABLED;
  this->FormattedBuffers = DEVICE_FEATURE_STATE_DISABLED;
  this->SeparablePrograms = State;
  this->ShaderResourceQueries = State;
  this->WireframeFill = State;
  this->MultithreadedResourceCreation = State;
  this->ComputeShaders = State;
  this->GeometryShaders = State;
  this->Tessellation = State;
  this->MeshShaders = State;
  this->RayTracing = State;
  this->BindlessResources = State;
  this->OcclusionQueries = State;
  this->BinaryOcclusionQueries = State;
  this->TimestampQueries = State;
  this->PipelineStatisticsQueries = State;
  this->DurationQueries = State;
  this->DepthBiasClamp = State;
  this->DepthClamp = State;
  this->IndependentBlend = State;
  this->DualSourceBlend = State;
  this->MultiViewport = State;
  this->TextureCompressionBC = State;
  this->TextureCompressionETC2 = State;
  this->VertexPipelineUAVWritesAndAtomics = State;
  this->PixelUAVWritesAndAtomics = State;
  this->TextureUAVExtendedFormats = State;
  this->ShaderFloat16 = State;
  this->ResourceBuffer16BitAccess = State;
  this->UniformBuffer16BitAccess = State;
  this->ShaderInputOutput16 = State;
  this->ShaderInt8 = State;
  this->ResourceBuffer8BitAccess = State;
  this->UniformBuffer8BitAccess = State;
  this->ShaderResourceStaticArrays = State;
  this->ShaderResourceRuntimeArrays = State;
  this->WaveOp = State;
  this->InstanceDataStepRate = State;
  this->NativeFence = State;
  this->TileShaders = State;
  this->TransferQueueTimestampQueries = State;
  this->VariableRateShading = State;
  this->SparseResources = State;
  this->SubpassFramebufferFetch = State;
  this->TextureComponentSwizzle = State;
  this->TextureSubresourceViews = State;
  this->NativeMultiDraw = State;
  this->AsyncShaderCompilation = State;
  this->FormattedBuffers = State;
  return;
}

Assistant:

explicit constexpr DeviceFeatures(DEVICE_FEATURE_STATE State) noexcept
    {
        static_assert(sizeof(*this) == 47, "Did you add a new feature to DeviceFeatures? Please add it to ENUMERATE_DEVICE_FEATURES.");
    #define INIT_FEATURE(Feature) Feature = State;
        ENUMERATE_DEVICE_FEATURES(INIT_FEATURE)
    #undef INIT_FEATURE
    }